

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testGccDepfileReader.cxx
# Opt level: O1

int testGccDepfileReader(int argc,char **argv)

{
  long *plVar1;
  pointer pbVar2;
  uint uVar3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  undefined8 *puVar9;
  ostream *poVar10;
  uint uVar11;
  long lVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dst;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this;
  pointer pbVar13;
  char *pcVar14;
  ulong uVar15;
  string base;
  string __str_1;
  string depfile;
  cmGccDepfileContent expected;
  optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_> actual;
  string plainDepfile;
  string line;
  string dataDirPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_398;
  long local_388;
  undefined8 uStack_380;
  undefined1 local_378 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_360;
  long *local_348;
  long local_340;
  long local_338 [2];
  vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_> local_328;
  _Storage<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false>
  local_310;
  char local_2f8;
  string local_2f0;
  ulong local_2d0;
  undefined1 local_2c8 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  string local_278;
  long *local_258;
  long local_250;
  long local_248 [2];
  string local_238 [16];
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Invalid arguments.\n",0x13);
    uVar11 = 0xffffffff;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,argv[1],(allocator<char> *)local_238);
    std::__cxx11::string::append((char *)&local_258);
    local_2d0 = 1;
    uVar3 = 1;
    do {
      uVar11 = uVar3;
      local_398 = &local_388;
      local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_238,local_258,local_250 + (long)local_258);
      std::__cxx11::string::append((char *)local_238);
      local_378._0_8_ = local_378 + 0x10;
      std::__cxx11::string::_M_construct((ulong)local_378,'\x01');
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_378._0_8_,1,(uint)local_2d0);
      pbVar13 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
        pbVar13 = (pointer)CONCAT71(local_238[0].field_2._M_allocated_capacity._1_7_,
                                    local_238[0].field_2._M_local_buf[0]);
      }
      pbVar2 = (pointer)((long)&((_Alloc_hider *)local_378._8_8_)->_M_p +
                        local_238[0]._M_string_length);
      if (pbVar13 < pbVar2) {
        pbVar13 = (pointer)0xf;
        if ((pointer)local_378._0_8_ != (pointer)(local_378 + 0x10)) {
          pbVar13 = (pointer)local_378._16_8_;
        }
        if (pbVar13 < pbVar2) goto LAB_00174353;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)local_378,0,(char *)0x0,(ulong)local_238[0]._M_dataplus._M_p);
      }
      else {
LAB_00174353:
        puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)local_238,local_378._0_8_);
      }
      plVar1 = puVar9 + 2;
      if ((long *)*puVar9 == plVar1) {
        local_388 = *plVar1;
        uStack_380 = puVar9[3];
      }
      else {
        local_388 = *plVar1;
        local_398 = (long *)*puVar9;
      }
      lVar12 = puVar9[1];
      *puVar9 = plVar1;
      puVar9[1] = 0;
      *(undefined1 *)plVar1 = 0;
      if ((pointer)local_378._0_8_ != (pointer)(local_378 + 0x10)) {
        operator_delete((void *)local_378._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_378._16_8_)->_M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
        operator_delete(local_238[0]._M_dataplus._M_p,
                        CONCAT71(local_238[0].field_2._M_allocated_capacity._1_7_,
                                 local_238[0].field_2._M_local_buf[0]) + 1);
      }
      local_348 = local_338;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_348,local_398,lVar12 + (long)local_398);
      std::__cxx11::string::append((char *)&local_348);
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2f0,local_398,lVar12 + (long)local_398);
      std::__cxx11::string::append((char *)&local_2f0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Comparing ",10);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_398,lVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," with ",6);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
      std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      local_238[0]._M_string_length = 0;
      local_238[0].field_2._M_local_buf[0] = '\0';
      local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
      cmReadGccDepfile((optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                        *)&local_310._M_value,(char *)local_348,local_238,All);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
        operator_delete(local_238[0]._M_dataplus._M_p,
                        CONCAT71(local_238[0].field_2._M_allocated_capacity._1_7_,
                                 local_238[0].field_2._M_local_buf[0]) + 1);
      }
      bVar4 = cmsys::SystemTools::FileExists(&local_2f0);
      if (!bVar4) {
        if (local_2f8 != '\x01') goto LAB_00174a7b;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Reading ",8);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,(char *)local_348,local_340);
        lVar12 = 0x14;
        pcVar14 = " should have failed\n";
LAB_00174b9d:
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar14,lVar12);
LAB_00174ba5:
        if (local_2f8 == '\x01') {
          local_2f8 = '\0';
          std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::~vector
                    (&local_310._M_value);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if (local_348 != local_338) {
          operator_delete(local_348,local_338[0] + 1);
        }
        if (local_398 != &local_388) {
          operator_delete(local_398,local_388 + 1);
        }
        break;
      }
      if (local_2f8 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Reading ",8);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,(char *)local_348,local_340);
        lVar12 = 0x17;
        pcVar14 = " should have succeeded\n";
        goto LAB_00174b9d;
      }
      local_328.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_328.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_328.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::ifstream::ifstream(local_238,local_2f0._M_dataplus._M_p,_S_in);
      cVar5 = std::__basic_file<char>::is_open();
      if (cVar5 != '\0') {
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        local_278._M_string_length = 0;
        local_278.field_2._M_local_buf[0] = '\0';
        vStack_360.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_360.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_378._16_8_ = (pointer)0x0;
        vStack_360.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_378._0_8_ = (pointer)0x0;
        local_378._8_8_ = (pointer)0x0;
        bVar4 = true;
LAB_001745e2:
        do {
          this = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vStack_360;
          if (bVar4) {
            this = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_378;
          }
          while( true ) {
            bVar4 = cmsys::SystemTools::GetLineFromStream
                              ((istream *)local_238,&local_278,(bool *)0x0,0xffffffffffffffff);
            if (!bVar4) {
              if (local_378._0_8_ != local_378._8_8_) {
                std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::
                emplace_back<cmGccStyleDependency>(&local_328,(cmGccStyleDependency *)local_378);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&vStack_360);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_378);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._M_dataplus._M_p != &local_278.field_2) {
                operator_delete(local_278._M_dataplus._M_p,
                                CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                         local_278.field_2._M_local_buf[0]) + 1);
              }
              goto LAB_00174836;
            }
            iVar7 = std::__cxx11::string::compare((char *)&local_278);
            bVar4 = iVar7 == 0;
            if (bVar4) break;
            iVar7 = std::__cxx11::string::compare((char *)&local_278);
            if (iVar7 == 0) goto LAB_001745e2;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(this,&local_278);
            local_2c8._8_8_ = (pointer)0x0;
            local_2c8._16_8_ = local_2c8._16_8_ & 0xffffffffffffff00;
            local_2c8._0_8_ = (pointer)(local_2c8 + 0x10);
            std::__cxx11::string::operator=((string *)&local_278,(string *)local_2c8);
            if ((pointer)local_2c8._0_8_ != (pointer)(local_2c8 + 0x10)) {
              operator_delete((void *)local_2c8._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_2c8._16_8_)->_M_p + 1));
            }
          }
          if (local_378._0_8_ != local_378._8_8_) {
            std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::
            emplace_back<cmGccStyleDependency>(&local_328,(cmGccStyleDependency *)local_378);
            local_298.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_378._16_8_;
            local_298.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_378._8_8_;
            local_298.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_378._0_8_;
            vStack_2b0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            vStack_2b0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            vStack_2b0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_378._0_8_ = (pointer)0x0;
            local_378._8_8_ = (pointer)0x0;
            local_378._16_8_ = (pointer)0x0;
            local_2c8._0_8_ = (pointer)0x0;
            local_2c8._8_8_ = (pointer)0x0;
            local_2c8._16_8_ = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_298);
            local_298.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 vStack_360.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_298.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 vStack_360.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_298.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 vStack_360.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            vStack_360.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 vStack_2b0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            vStack_360.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 vStack_2b0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            vStack_360.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 vStack_2b0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            vStack_2b0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            vStack_2b0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            vStack_2b0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_298);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&vStack_2b0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_2c8);
          }
        } while( true );
      }
LAB_00174836:
      std::ifstream::~ifstream(local_238);
      if ((long)local_310._M_value.
                super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
                _M_impl.super__Vector_impl_data._M_finish - local_310._0_8_ ==
          (long)local_328.
                super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_328.
                super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
                _M_impl.super__Vector_impl_data._M_start) {
        bVar4 = local_310._M_value.
                super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_310._M_value.
                super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
                _M_impl.super__Vector_impl_data._M_start;
        if (!bVar4) {
          lVar12 = 0x18;
          uVar15 = 0;
          do {
            bVar6 = anon_unknown.dwarf_9341d::compare
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)((long)local_310._M_value.
                                         super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar12 + -0x18)
                               ,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)((long)local_328.
                                          super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar12 + -0x18
                                   ),"Rules differ: ");
            if ((!bVar6) ||
               (bVar6 = anon_unknown.dwarf_9341d::compare
                                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)((long)&((local_310._M_value.
                                                super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->rules).
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + lVar12),
                                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)((long)&((local_328.
                                                super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->rules).
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + lVar12),
                                   "Paths differ: "), !bVar6)) break;
            uVar15 = uVar15 + 1;
            lVar12 = lVar12 + 0x30;
            bVar6 = uVar15 < (ulong)(((long)local_310._M_value.
                                            super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      local_310._0_8_ >> 4) * -0x5555555555555555);
            bVar4 = !bVar6;
          } while (bVar6);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Expected ",9);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," entries.",9);
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
        std::ostream::put((char)poVar10);
        poVar10 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"Actual number of entries: ",0x1a);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        bVar4 = false;
      }
      if (!bVar4) {
        anon_unknown.dwarf_9341d::dump("actual",&local_310._M_value);
        anon_unknown.dwarf_9341d::dump("expected",&local_328);
        std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::~vector
                  (&local_328);
        if (bVar4) goto LAB_00174a7b;
        goto LAB_00174ba5;
      }
      std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::~vector(&local_328);
LAB_00174a7b:
      if (local_2f8 == '\x01') {
        local_2f8 = '\0';
        std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::~vector
                  (&local_310._M_value);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      if (local_348 != local_338) {
        operator_delete(local_348,local_338[0] + 1);
      }
      if (local_398 != &local_388) {
        operator_delete(local_398,local_388 + 1);
      }
      uVar8 = (uint)local_2d0;
      uVar11 = (uint)(uVar8 < 7);
      local_2d0 = (ulong)(uVar8 + 1);
      uVar3 = (uint)(uVar8 < 7);
    } while (uVar8 + 1 != 8);
    if (local_258 != local_248) {
      operator_delete(local_258,local_248[0] + 1);
    }
  }
  return uVar11;
}

Assistant:

int testGccDepfileReader(int argc, char* argv[])
{
  if (argc < 2) {
    std::cout << "Invalid arguments.\n";
    return -1;
  }

  std::string dataDirPath = argv[1];
  dataDirPath += "/testGccDepfileReader_data";
  const int numberOfTestFiles = 7; // 6th file doesn't exist
  for (int i = 1; i <= numberOfTestFiles; ++i) {
    const std::string base = dataDirPath + "/deps" + std::to_string(i);
    const std::string depfile = base + ".d";
    const std::string plainDepfile = base + ".txt";
    std::cout << "Comparing " << base << " with " << plainDepfile << std::endl;
    const auto actual = cmReadGccDepfile(depfile.c_str());
    if (cmSystemTools::FileExists(plainDepfile)) {
      if (!actual) {
        std::cerr << "Reading " << depfile << " should have succeeded\n";
        return 1;
      }
      const auto expected = readPlainDepfile(plainDepfile.c_str());
      if (!compare(*actual, expected)) {
        dump("actual", *actual);
        dump("expected", expected);
        return 1;
      }
    } else if (actual) {
      std::cerr << "Reading " << depfile << " should have failed\n";
      return 1;
    }
  }

  return 0;
}